

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::AC3DImporter::CanRead(AC3DImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  undefined4 local_64;
  undefined4 local_60;
  uint32_t token;
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  AC3DImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"ac");
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"ac3d");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"acc");
      if (!bVar1) {
        lVar2 = std::__cxx11::string::length();
        if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
          local_64 = 0x41433344;
          this_local._7_1_ = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_64,1,0,4);
        }
        else {
          this_local._7_1_ = false;
        }
        goto LAB_00615923;
      }
    }
  }
  this_local._7_1_ = true;
LAB_00615923:
  local_60 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool AC3DImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    std::string extension = GetExtension(pFile);

    // fixme: are acc and ac3d *really* used? Some sources say they are
    if(extension == "ac" || extension == "ac3d" || extension == "acc") {
        return true;
    }
    if (!extension.length() || checkSig) {
        uint32_t token = AI_MAKE_MAGIC("AC3D");
        return CheckMagicToken(pIOHandler,pFile,&token,1,0);
    }
    return false;
}